

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void __thiscall duckdb_parquet::KeyValue::KeyValue(KeyValue *this,KeyValue *other89)

{
  *(undefined ***)this = &PTR__KeyValue_0247d660;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  (this->key)._M_string_length = 0;
  (this->key).field_2._M_local_buf[0] = '\0';
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  this->__isset = (_KeyValue__isset)((byte)this->__isset & 0xfe);
  std::__cxx11::string::_M_assign((string *)&this->key);
  std::__cxx11::string::_M_assign((string *)&this->value);
  this->__isset = other89->__isset;
  return;
}

Assistant:

KeyValue::KeyValue(const KeyValue& other89) {
  key = other89.key;
  value = other89.value;
  __isset = other89.__isset;
}